

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# native.c
# Opt level: O1

void unload_all(void)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  if (0 < libCount) {
    lVar2 = 8;
    lVar3 = 0;
    do {
      dlclose(*(undefined8 *)((long)&libraries->name + lVar2));
      lVar1 = dlerror();
      if (lVar1 != 0) {
        printf("\x1b[33m\n[Warning] %s\x1b[0m",lVar1);
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x10;
    } while (lVar3 < libCount);
  }
  free(libraries);
  libCount = 0;
  libraries = (Library *)0x0;
  return;
}

Assistant:

void unload_all(){
    int i = 0;
    char *err = NULL;
    while(i < libCount){
        dlclose(libraries[i].handle);
        if((err = dlerror()) != NULL)
            printf(warning("%s"), err);
        i++;
    }
    memfree(libraries);
    libCount = 0;
    libraries = NULL;
}